

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O3

void __thiscall Imf_2_5::DwaCompressor::LossyDctEncoderBase::execute(LossyDctEncoderBase *this)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  int iVar7;
  long lVar8;
  pointer pSVar9;
  float *pfVar10;
  float *pfVar11;
  half hVar12;
  short sVar13;
  uint uVar14;
  uint uVar15;
  __m128 *srcVec;
  long lVar16;
  ulong uVar17;
  float *pfVar18;
  half *phVar19;
  unsigned_short *puVar20;
  bool bVar21;
  pointer pvVar22;
  bool bVar23;
  uint uVar24;
  int iVar25;
  pointer pvVar26;
  LossyDctEncoderBase *pLVar27;
  LossyDctEncoderBase *pLVar28;
  int iVar29;
  int x;
  uint uVar30;
  ulong uVar31;
  LossyDctEncoderBase *pLVar32;
  LossyDctEncoderBase *pLVar33;
  long lVar34;
  int iVar35;
  LossyDctEncoderBase *this_00;
  ushort uVar36;
  int iVar37;
  long lVar38;
  int y;
  _func_int **pp_Var39;
  bool bVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  uchar b [4];
  vector<unsigned_short_*,_std::allocator<unsigned_short_*>_> currDcComp;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpHalfBuffer;
  unsigned_short *currAcComp;
  half halfCoef [64];
  half halfZigCoef [64];
  float local_1dc;
  vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  *local_1d8;
  pointer local_1d0;
  ulong local_1c8;
  LossyDctEncoderBase *local_1c0;
  ulong local_1b8;
  _func_int **local_1b0;
  LossyDctEncoderBase *local_1a8;
  vector<unsigned_short_*,_std::allocator<unsigned_short_*>_> local_1a0;
  undefined1 local_188 [40];
  pointer local_160;
  pointer local_158;
  pointer local_150;
  LossyDctEncoderBase *local_148;
  pointer local_140;
  unsigned_short auStack_138 [64];
  half local_b8 [68];
  
  fVar41 = ceilf((float)this->_width * 0.125);
  local_1d0 = (pointer)CONCAT44(local_1d0._4_4_,fVar41);
  fVar41 = ceilf((float)this->_height * 0.125);
  std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::vector
            (&local_1a0,
             ((long)(this->_rowPtrs).
                    super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_rowPtrs).
                    super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)local_188);
  local_140 = (pointer)this->_packedAc;
  local_1d8 = &this->_dctData;
  std::
  vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  ::resize(local_1d8,
           ((long)(this->_rowPtrs).
                  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->_rowPtrs).
                  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pvVar22 = (this->_rowPtrs).
            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pvVar26 = (this->_rowPtrs).
            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this->_numAcComp = 0;
  this->_numDcComp = 0;
  lVar16 = (long)pvVar22 - (long)pvVar26;
  if (lVar16 == 0) {
    iVar29 = 0;
  }
  else {
    uVar17 = (lVar16 >> 3) * -0x5555555555555555;
    uVar31 = 0;
    iVar29 = 0;
    do {
      iVar35 = 0;
      if ((this->_type).super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar31] == FLOAT) {
        iVar35 = this->_height * this->_width;
      }
      iVar29 = iVar29 + iVar35;
      uVar31 = uVar31 + 1;
    } while ((uVar31 & 0xffffffff) <= uVar17 && uVar17 - (uVar31 & 0xffffffff) != 0);
  }
  this_00 = (LossyDctEncoderBase *)local_188;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this_00,(long)iVar29,
             (allocator_type *)&local_1dc);
  pvVar22 = (this->_rowPtrs).
            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar26 = (this->_rowPtrs).
            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar26 != pvVar22) {
    this_00 = (LossyDctEncoderBase *)0x0;
    pp_Var39 = (_func_int **)0x0;
    if (iVar29 != 0) {
      pp_Var39 = (_func_int **)local_188._0_8_;
    }
    iVar29 = this->_height;
    do {
      if (((this->_type).super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>
           ._M_impl.super__Vector_impl_data._M_start[(long)this_00] == FLOAT) && (0 < iVar29)) {
        uVar17 = (long)this_00 * 3;
        uVar31 = 0;
        local_1c8 = uVar17;
        local_1c0 = this_00;
        do {
          lVar16 = *(long *)((long)&(((this->_rowPtrs).
                                      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)
                                    ._M_impl.super__Vector_impl_data + uVar17 * 8);
          iVar35 = this->_width;
          if (0 < iVar35) {
            lVar16 = *(long *)(lVar16 + uVar31 * 8);
            iVar29 = 0;
            local_1b8 = uVar31;
            local_1b0 = pp_Var39;
            do {
              lVar38 = 0;
              do {
                *(undefined1 *)((long)&local_1dc + lVar38) = *(undefined1 *)(lVar16 + lVar38);
                fVar42 = local_1dc;
                lVar38 = lVar38 + 1;
              } while ((int)lVar38 != 4);
              hVar12 = std::numeric_limits<half>::max();
              if (half::_toFloat[hVar12._h].f <= fVar42) {
                fVar42 = half::_toFloat[hVar12._h].f;
              }
              hVar12 = std::numeric_limits<half>::max();
              fVar43 = half::_toFloat[hVar12._h ^ 0x8000].f;
              if (half::_toFloat[hVar12._h ^ 0x8000].f <= fVar42) {
                fVar43 = fVar42;
              }
              if ((fVar43 != 0.0) || (NAN(fVar43))) {
                if (half::_eLut[(uint)fVar43 >> 0x17] == 0) {
                  sVar13 = half::convert((int)fVar43);
                }
                else {
                  sVar13 = half::_eLut[(uint)fVar43 >> 0x17] +
                           (short)(((uint)fVar43 & 0x7fffff) + 0xfff +
                                   (uint)(((uint)fVar43 >> 0xd & 1) != 0) >> 0xd);
                }
              }
              else {
                sVar13 = (short)((uint)fVar43 >> 0x10);
              }
              lVar16 = lVar16 + lVar38;
              *(short *)pp_Var39 = sVar13;
              pp_Var39 = (_func_int **)((long)pp_Var39 + 2);
              iVar29 = iVar29 + 1;
              iVar35 = this->_width;
            } while (iVar29 < iVar35);
            lVar16 = *(long *)((long)&(((this->_rowPtrs).
                                        super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                      )._M_impl.super__Vector_impl_data + local_1c8 * 8);
            iVar29 = this->_height;
            uVar17 = local_1c8;
            this_00 = local_1c0;
            uVar31 = local_1b8;
            pp_Var39 = local_1b0;
          }
          *(_func_int ***)(lVar16 + uVar31 * 8) = pp_Var39;
          pp_Var39 = (_func_int **)((long)pp_Var39 + (long)iVar35 * 2);
          uVar31 = uVar31 + 1;
        } while ((long)uVar31 < (long)iVar29);
        pvVar22 = (this->_rowPtrs).
                  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar26 = (this->_rowPtrs).
                  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      this_00 = (LossyDctEncoderBase *)(ulong)((int)this_00 + 1);
      pLVar32 = (LossyDctEncoderBase *)(((long)pvVar26 - (long)pvVar22 >> 3) * -0x5555555555555555);
    } while (this_00 <= pLVar32 && (long)pLVar32 - (long)this_00 != 0);
  }
  uVar14 = (uint)local_1d0._0_4_;
  uVar15 = (uint)fVar41;
  *local_1a0.super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
   super__Vector_impl_data._M_start = (unsigned_short *)this->_packedDc;
  pLVar32 = (LossyDctEncoderBase *)
            (this->_rowPtrs).
            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pLVar28 = (LossyDctEncoderBase *)
            (this->_rowPtrs).
            super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (1 < (ulong)(((long)pLVar28 - (long)pLVar32 >> 3) * -0x5555555555555555)) {
    pLVar27 = (LossyDctEncoderBase *)0x1;
    pLVar33 = (LossyDctEncoderBase *)0x2;
    do {
      local_1a0.super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
      super__Vector_impl_data._M_start[(long)pLVar27] =
           local_1a0.super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl
           .super__Vector_impl_data._M_start[(int)pLVar33 - 2] + (int)(uVar15 * uVar14);
      pLVar32 = (LossyDctEncoderBase *)
                (this->_rowPtrs).
                super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pLVar28 = (LossyDctEncoderBase *)
                (this->_rowPtrs).
                super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      this_00 = (LossyDctEncoderBase *)(((long)pLVar28 - (long)pLVar32 >> 3) * -0x5555555555555555);
      bVar40 = pLVar33 <= this_00;
      lVar16 = (long)this_00 - (long)pLVar33;
      pLVar27 = pLVar33;
      pLVar33 = (LossyDctEncoderBase *)(ulong)((int)pLVar33 + 1);
    } while (bVar40 && lVar16 != 0);
  }
  if (0 < (int)uVar15) {
    local_188._24_8_ = ZEXT48(uVar15);
    local_160 = (pointer)(ulong)uVar14;
    puVar20 = (unsigned_short *)0x0;
    pLVar27 = pLVar28;
    local_1a8 = this;
    do {
      local_188._32_8_ = puVar20;
      if (0 < (int)uVar14) {
        local_1b0 = (_func_int **)((long)puVar20 * 8);
        iVar29 = -1;
        iVar35 = 0;
        pvVar22 = (pointer)0x0;
        do {
          pLVar33 = local_1a8;
          local_150 = (pointer)((long)pLVar28 - (long)pLVar32);
          if (local_150 != (pointer)0x0) {
            local_1c8 = ((long)pLVar28 - (long)pLVar32 >> 3) * -0x5555555555555555;
            uVar15 = local_1a8->_width;
            this_00 = (LossyDctEncoderBase *)(ulong)uVar15;
            iVar7 = local_1a8->_height;
            puVar20 = local_1a8->_toNonlinear;
            local_1d0 = (local_1a8->_dctData).
                        super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            uVar17 = 0;
            do {
              local_1b8 = uVar17;
              lVar16 = *(long *)(pLVar32->_quantTableY + local_1b8 * 6 + -0x20);
              pfVar18 = local_1d0[local_1b8]._buffer;
              lVar38 = 0;
              do {
                uVar24 = (int)local_1b0 + (int)lVar38;
                uVar30 = ~uVar24 + iVar7 * 2;
                if ((int)uVar24 < iVar7) {
                  uVar30 = uVar24;
                }
                if ((int)uVar30 < 0) {
                  uVar30 = iVar7 - 1;
                }
                lVar8 = *(long *)(lVar16 + (long)(int)uVar30 * 8);
                lVar34 = 0;
                iVar25 = iVar29 + uVar15 * 2;
                do {
                  iVar37 = (int)lVar34 + iVar35;
                  if ((int)uVar15 <= iVar37) {
                    iVar37 = iVar25;
                  }
                  if (iVar37 < 0) {
                    iVar37 = uVar15 - 1;
                  }
                  uVar36 = *(ushort *)(lVar8 + (long)iVar37 * 2);
                  if (puVar20 != (unsigned_short *)0x0) {
                    uVar36 = puVar20[uVar36];
                  }
                  *(uif *)(pfVar18 + lVar34) = half::_toFloat[uVar36];
                  lVar34 = lVar34 + 1;
                  iVar25 = iVar25 + -1;
                } while (lVar34 != 8);
                lVar38 = lVar38 + 1;
                pfVar18 = pfVar18 + 8;
              } while (lVar38 != 8);
              uVar17 = local_1b8 + 1;
              local_1c0 = pLVar32;
            } while ((local_1b8 + 1 & 0xffffffff) < local_1c8);
          }
          if (local_150 == (pointer)0x48) {
            pSVar9 = (local_1d8->
                     super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pfVar18 = pSVar9->_buffer;
            pfVar10 = pSVar9[1]._buffer;
            pfVar11 = pSVar9[2]._buffer;
            lVar16 = 0;
            do {
              fVar41 = pfVar18[lVar16];
              fVar42 = pfVar10[lVar16];
              fVar43 = pfVar11[lVar16];
              pfVar18[lVar16] = fVar43 * 0.0722 + fVar41 * 0.2126 + fVar42 * 0.7152;
              pfVar10[lVar16] = fVar43 * 0.5 + fVar41 * -0.1146 + fVar42 * -0.3854;
              pfVar11[lVar16] = fVar43 * -0.0458 + fVar41 * 0.5 + fVar42 * -0.4542;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 0x40);
          }
          pLVar28 = pLVar32;
          local_158 = pvVar22;
          local_148 = pLVar27;
          if (pLVar27 != pLVar32) {
            uVar17 = 0;
            do {
              pfVar18 = (local_1d8->
                        super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar17]._buffer;
              bVar40 = true;
              do {
                bVar21 = bVar40;
                lVar16 = 0;
                bVar40 = true;
                do {
                  bVar23 = bVar40;
                  pfVar3 = pfVar18 + lVar16 * 4 + 0x38;
                  pfVar10 = pfVar18 + lVar16 * 4;
                  pfVar11 = pfVar18 + lVar16 * 4 + 8;
                  pfVar1 = pfVar18 + lVar16 * 4 + 0x10;
                  pfVar2 = pfVar18 + lVar16 * 4 + 0x18;
                  fVar61 = *pfVar10 + *pfVar3;
                  fVar62 = pfVar10[1] + pfVar3[1];
                  fVar63 = pfVar10[2] + pfVar3[2];
                  fVar64 = pfVar10[3] + pfVar3[3];
                  fVar41 = *pfVar11 + *pfVar1;
                  fVar42 = pfVar11[1] + pfVar1[1];
                  fVar43 = pfVar11[2] + pfVar1[2];
                  fVar44 = pfVar11[3] + pfVar1[3];
                  pfVar4 = pfVar18 + lVar16 * 4 + 0x20;
                  fVar69 = *pfVar2 + *pfVar4;
                  fVar70 = pfVar2[1] + pfVar4[1];
                  fVar71 = pfVar2[2] + pfVar4[2];
                  fVar72 = pfVar2[3] + pfVar4[3];
                  pfVar5 = pfVar18 + lVar16 * 4 + 0x28;
                  pfVar6 = pfVar18 + lVar16 * 4 + 0x30;
                  fVar49 = *pfVar10 - *pfVar3;
                  fVar50 = pfVar10[1] - pfVar3[1];
                  fVar51 = pfVar10[2] - pfVar3[2];
                  fVar52 = pfVar10[3] - pfVar3[3];
                  fVar65 = *pfVar5 + *pfVar6;
                  fVar66 = pfVar5[1] + pfVar6[1];
                  fVar67 = pfVar5[2] + pfVar6[2];
                  fVar68 = pfVar5[3] + pfVar6[3];
                  fVar57 = *pfVar11 - *pfVar1;
                  fVar58 = pfVar11[1] - pfVar1[1];
                  fVar59 = pfVar11[2] - pfVar1[2];
                  fVar60 = pfVar11[3] - pfVar1[3];
                  fVar53 = *pfVar2 - *pfVar4;
                  fVar54 = pfVar2[1] - pfVar4[1];
                  fVar55 = pfVar2[2] - pfVar4[2];
                  fVar56 = pfVar2[3] - pfVar4[3];
                  fVar45 = *pfVar5 - *pfVar6;
                  fVar46 = pfVar5[1] - pfVar6[1];
                  fVar47 = pfVar5[2] - pfVar6[2];
                  fVar48 = pfVar5[3] - pfVar6[3];
                  fVar73 = (fVar61 + fVar69) * 0.70710677;
                  fVar74 = (fVar62 + fVar70) * 0.70710677;
                  fVar75 = (fVar63 + fVar71) * 0.70710677;
                  fVar76 = (fVar64 + fVar72) * 0.70710677;
                  fVar77 = (fVar41 + fVar65) * 0.70710677;
                  fVar78 = (fVar42 + fVar66) * 0.70710677;
                  fVar79 = (fVar43 + fVar67) * 0.70710677;
                  fVar80 = (fVar44 + fVar68) * 0.70710677;
                  pfVar10 = pfVar18 + lVar16 * 4;
                  *pfVar10 = (fVar73 + fVar77) * 0.5;
                  pfVar10[1] = (fVar74 + fVar78) * 0.5;
                  pfVar10[2] = (fVar75 + fVar79) * 0.5;
                  pfVar10[3] = (fVar76 + fVar80) * 0.5;
                  pfVar10 = pfVar18 + lVar16 * 4 + 0x20;
                  *pfVar10 = (fVar73 - fVar77) * 0.5;
                  pfVar10[1] = (fVar74 - fVar78) * 0.5;
                  pfVar10[2] = (fVar75 - fVar79) * 0.5;
                  pfVar10[3] = (fVar76 - fVar80) * 0.5;
                  fVar73 = fVar57 - fVar45;
                  fVar74 = fVar58 - fVar46;
                  fVar75 = fVar59 - fVar47;
                  fVar76 = fVar60 - fVar48;
                  fVar61 = fVar61 - fVar69;
                  fVar62 = fVar62 - fVar70;
                  fVar63 = fVar63 - fVar71;
                  fVar64 = fVar64 - fVar72;
                  pfVar10 = pfVar18 + lVar16 * 4 + 0x10;
                  *pfVar10 = fVar61 * 0.46193978 + fVar73 * 0.19134171;
                  pfVar10[1] = fVar62 * 0.46193978 + fVar74 * 0.19134171;
                  pfVar10[2] = fVar63 * 0.46193978 + fVar75 * 0.19134171;
                  pfVar10[3] = fVar64 * 0.46193978 + fVar76 * 0.19134171;
                  pfVar10 = pfVar18 + lVar16 * 4 + 0x30;
                  *pfVar10 = fVar61 * 0.19134171 - fVar73 * 0.46193978;
                  pfVar10[1] = fVar62 * 0.19134171 - fVar74 * 0.46193978;
                  pfVar10[2] = fVar63 * 0.19134171 - fVar75 * 0.46193978;
                  pfVar10[3] = fVar64 * 0.19134171 - fVar76 * 0.46193978;
                  fVar41 = (fVar41 - fVar65) * 0.70710677;
                  fVar42 = (fVar42 - fVar66) * 0.70710677;
                  fVar43 = (fVar43 - fVar67) * 0.70710677;
                  fVar44 = (fVar44 - fVar68) * 0.70710677;
                  fVar45 = (fVar45 + fVar57) * -0.70710677;
                  fVar46 = (fVar46 + fVar58) * -0.70710677;
                  fVar47 = (fVar47 + fVar59) * -0.70710677;
                  fVar48 = (fVar48 + fVar60) * -0.70710677;
                  fVar57 = fVar49 - fVar41;
                  fVar58 = fVar50 - fVar42;
                  fVar59 = fVar51 - fVar43;
                  fVar60 = fVar52 - fVar44;
                  fVar61 = fVar53 + fVar45;
                  fVar62 = fVar54 + fVar46;
                  fVar63 = fVar55 + fVar47;
                  fVar64 = fVar56 + fVar48;
                  pfVar10 = pfVar18 + lVar16 * 4 + 0x18;
                  *pfVar10 = fVar57 * 0.4157348 - fVar61 * 0.27778512;
                  pfVar10[1] = fVar58 * 0.4157348 - fVar62 * 0.27778512;
                  pfVar10[2] = fVar59 * 0.4157348 - fVar63 * 0.27778512;
                  pfVar10[3] = fVar60 * 0.4157348 - fVar64 * 0.27778512;
                  pfVar10 = pfVar18 + lVar16 * 4 + 0x28;
                  *pfVar10 = fVar61 * 0.4157348 + fVar57 * 0.27778512;
                  pfVar10[1] = fVar62 * 0.4157348 + fVar58 * 0.27778512;
                  pfVar10[2] = fVar63 * 0.4157348 + fVar59 * 0.27778512;
                  pfVar10[3] = fVar64 * 0.4157348 + fVar60 * 0.27778512;
                  fVar41 = fVar41 + fVar49;
                  fVar42 = fVar42 + fVar50;
                  fVar43 = fVar43 + fVar51;
                  fVar44 = fVar44 + fVar52;
                  fVar45 = fVar45 - fVar53;
                  fVar46 = fVar46 - fVar54;
                  fVar47 = fVar47 - fVar55;
                  fVar48 = fVar48 - fVar56;
                  pfVar10 = pfVar18 + lVar16 * 4 + 8;
                  *pfVar10 = fVar41 * 0.49039263 - fVar45 * 0.09754516;
                  pfVar10[1] = fVar42 * 0.49039263 - fVar46 * 0.09754516;
                  pfVar10[2] = fVar43 * 0.49039263 - fVar47 * 0.09754516;
                  pfVar10[3] = fVar44 * 0.49039263 - fVar48 * 0.09754516;
                  pfVar10 = pfVar18 + lVar16 * 4 + 0x38;
                  *pfVar10 = fVar45 * 0.49039263 + fVar41 * 0.09754516;
                  pfVar10[1] = fVar46 * 0.49039263 + fVar42 * 0.09754516;
                  pfVar10[2] = fVar47 * 0.49039263 + fVar43 * 0.09754516;
                  pfVar10[3] = fVar48 * 0.49039263 + fVar44 * 0.09754516;
                  lVar16 = 1;
                  bVar40 = false;
                } while (bVar23);
                fVar41 = pfVar18[1];
                fVar42 = pfVar18[2];
                fVar43 = pfVar18[3];
                fVar44 = pfVar18[0xb];
                fVar45 = pfVar18[0x11];
                fVar46 = pfVar18[0x13];
                fVar47 = pfVar18[0x25];
                fVar48 = pfVar18[0x26];
                fVar49 = pfVar18[0x27];
                fVar50 = pfVar18[0x2f];
                fVar51 = pfVar18[0x35];
                fVar52 = pfVar18[0x37];
                *pfVar18 = *pfVar18;
                pfVar18[1] = pfVar18[8];
                pfVar18[2] = pfVar18[0x10];
                pfVar18[3] = pfVar18[0x18];
                pfVar18[0x10] = fVar42;
                pfVar18[0x11] = pfVar18[10];
                pfVar18[0x12] = pfVar18[0x12];
                pfVar18[0x13] = pfVar18[0x1a];
                pfVar18[8] = fVar41;
                pfVar18[9] = pfVar18[9];
                pfVar18[10] = fVar45;
                pfVar18[0xb] = pfVar18[0x19];
                pfVar18[0x18] = fVar43;
                pfVar18[0x19] = fVar44;
                pfVar18[0x1a] = fVar46;
                pfVar18[0x1b] = pfVar18[0x1b];
                pfVar18[0x24] = pfVar18[0x24];
                pfVar18[0x25] = pfVar18[0x2c];
                pfVar18[0x26] = pfVar18[0x34];
                pfVar18[0x27] = pfVar18[0x3c];
                pfVar18[0x34] = fVar48;
                pfVar18[0x35] = pfVar18[0x2e];
                pfVar18[0x36] = pfVar18[0x36];
                pfVar18[0x37] = pfVar18[0x3e];
                pfVar18[0x2c] = fVar47;
                pfVar18[0x2d] = pfVar18[0x2d];
                pfVar18[0x2e] = fVar51;
                pfVar18[0x2f] = pfVar18[0x3d];
                pfVar18[0x3c] = fVar49;
                pfVar18[0x3d] = fVar50;
                pfVar18[0x3e] = fVar52;
                pfVar18[0x3f] = pfVar18[0x3f];
                fVar41 = pfVar18[0x20];
                fVar42 = pfVar18[0x21];
                fVar43 = pfVar18[0x22];
                fVar44 = pfVar18[0x23];
                fVar45 = pfVar18[0x28];
                fVar46 = pfVar18[0x29];
                fVar47 = pfVar18[0x2a];
                fVar48 = pfVar18[0x2b];
                fVar49 = pfVar18[0x30];
                fVar50 = pfVar18[0x31];
                fVar51 = pfVar18[0x32];
                fVar52 = pfVar18[0x33];
                fVar53 = pfVar18[0x38];
                fVar54 = pfVar18[0x39];
                fVar55 = pfVar18[0x3a];
                fVar56 = pfVar18[0x3b];
                pfVar18[0x20] = pfVar18[4];
                pfVar18[0x21] = pfVar18[0xc];
                pfVar18[0x22] = pfVar18[0x14];
                pfVar18[0x23] = pfVar18[0x1c];
                pfVar18[0x30] = pfVar18[6];
                pfVar18[0x31] = pfVar18[0xe];
                pfVar18[0x32] = pfVar18[0x16];
                pfVar18[0x33] = pfVar18[0x1e];
                pfVar18[0x28] = pfVar18[5];
                pfVar18[0x29] = pfVar18[0xd];
                pfVar18[0x2a] = pfVar18[0x15];
                pfVar18[0x2b] = pfVar18[0x1d];
                pfVar18[0x38] = pfVar18[7];
                pfVar18[0x39] = pfVar18[0xf];
                pfVar18[0x3a] = pfVar18[0x17];
                pfVar18[0x3b] = pfVar18[0x1f];
                pfVar18[4] = fVar41;
                pfVar18[5] = fVar45;
                pfVar18[6] = fVar49;
                pfVar18[7] = fVar53;
                pfVar18[0x14] = fVar43;
                pfVar18[0x15] = fVar47;
                pfVar18[0x16] = fVar51;
                pfVar18[0x17] = fVar55;
                pfVar18[0xc] = fVar42;
                pfVar18[0xd] = fVar46;
                pfVar18[0xe] = fVar50;
                pfVar18[0xf] = fVar54;
                pfVar18[0x1c] = fVar44;
                pfVar18[0x1d] = fVar48;
                pfVar18[0x1e] = fVar52;
                pfVar18[0x1f] = fVar56;
                bVar40 = false;
              } while (bVar21);
              if ((int)uVar17 == 0) {
                lVar16 = 0;
                do {
                  fVar41 = (local_1d8->
                           super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar17]._buffer[lVar16];
                  if ((fVar41 != 0.0) || (NAN(fVar41))) {
                    if (half::_eLut[(uint)fVar41 >> 0x17] == 0) {
                      this_00 = (LossyDctEncoderBase *)(ulong)(uint)fVar41;
                      hVar12._h = half::convert((int)fVar41);
                    }
                    else {
                      hVar12._h = half::_eLut[(uint)fVar41 >> 0x17] +
                                  (short)(((uint)fVar41 & 0x7fffff) + 0xfff +
                                          (uint)(((uint)fVar41 >> 0xd & 1) != 0) >> 0xd);
                    }
                  }
                  else {
                    hVar12._h = (unsigned_short)((uint)fVar41 >> 0x10);
                  }
                  hVar12 = quantize(this_00,hVar12,
                                    pLVar33->_quantBaseError * pLVar33->_quantTableY[lVar16]);
                  auStack_138[lVar16] = hVar12._h;
                  lVar16 = lVar16 + 1;
                } while (lVar16 != 0x40);
              }
              else {
                lVar16 = 0;
                do {
                  fVar41 = (local_1d8->
                           super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar17]._buffer[lVar16];
                  if ((fVar41 != 0.0) || (NAN(fVar41))) {
                    if (half::_eLut[(uint)fVar41 >> 0x17] == 0) {
                      this_00 = (LossyDctEncoderBase *)(ulong)(uint)fVar41;
                      hVar12._h = half::convert((int)fVar41);
                    }
                    else {
                      hVar12._h = half::_eLut[(uint)fVar41 >> 0x17] +
                                  (short)(((uint)fVar41 & 0x7fffff) + 0xfff +
                                          (uint)(((uint)fVar41 >> 0xd & 1) != 0) >> 0xd);
                    }
                  }
                  else {
                    hVar12._h = (unsigned_short)((uint)fVar41 >> 0x10);
                  }
                  hVar12 = quantize(this_00,hVar12,
                                    pLVar33->_quantBaseError * pLVar33->_quantTableCbCr[lVar16]);
                  auStack_138[lVar16] = hVar12._h;
                  lVar16 = lVar16 + 1;
                } while (lVar16 != 0x40);
              }
              phVar19 = local_b8;
              lVar16 = 0;
              do {
                phVar19->_h = auStack_138
                              [*(int *)((long)L"8ccccc/Bcccccccccccccccccccccccccccccccccccccc" +
                                       lVar16 + 0xb8)];
                lVar16 = lVar16 + 4;
                phVar19 = phVar19 + 1;
              } while (lVar16 != 0x100);
              puVar20 = local_1a0.
                        super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar17];
              local_1a0.super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar17] = puVar20 + 1;
              *puVar20 = local_b8[0]._h;
              pLVar33->_numDcComp = pLVar33->_numDcComp + 1;
              this_00 = pLVar33;
              rleAc(pLVar33,local_b8,(unsigned_short **)&local_140);
              uVar17 = (ulong)((int)uVar17 + 1);
              pLVar32 = (LossyDctEncoderBase *)
                        (pLVar33->_rowPtrs).
                        super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pLVar28 = (LossyDctEncoderBase *)
                        (pLVar33->_rowPtrs).
                        super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              uVar31 = ((long)pLVar28 - (long)pLVar32 >> 3) * -0x5555555555555555;
            } while (uVar17 <= uVar31 && uVar31 - uVar17 != 0);
          }
          pvVar22 = (pointer)((long)&(local_158->
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1);
          iVar35 = iVar35 + 8;
          iVar29 = iVar29 + -8;
          pLVar27 = pLVar28;
        } while (pvVar22 != local_160);
      }
      puVar20 = (unsigned_short *)(local_188._32_8_ + 1);
    } while (puVar20 != (unsigned_short *)local_188._24_8_);
  }
  if ((_func_int **)local_188._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ - local_188._0_8_);
  }
  if (local_1a0.super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.
                    super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a0.
                          super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.
                          super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
DwaCompressor::LossyDctEncoderBase::execute ()
{
    int  numBlocksX   = (int)ceil ((float)_width / 8.0f);
    int  numBlocksY   = (int)ceil ((float)_height/ 8.0f);

    half halfZigCoef[64]; 
    half halfCoef[64];

    std::vector<unsigned short *> currDcComp (_rowPtrs.size());
    unsigned short               *currAcComp = (unsigned short *)_packedAc;

    _dctData.resize (_rowPtrs.size());
    _numAcComp = 0;
    _numDcComp = 0;
 
    assert (_type.size() == _rowPtrs.size());
    assert ((_rowPtrs.size() == 3) || (_rowPtrs.size() == 1));

    // 
    // Allocate a temp half buffer to quantize into for
    // any FLOAT source channels.
    //

    int tmpHalfBufferElements = 0;

    for (unsigned int chan = 0; chan < _rowPtrs.size(); ++chan)
        if (_type[chan] == FLOAT)
            tmpHalfBufferElements += _width * _height;

    std::vector<unsigned short> tmpHalfBuffer (tmpHalfBufferElements);

    char *tmpHalfBufferPtr = 0;

    if (tmpHalfBufferElements)
        tmpHalfBufferPtr = (char *)&tmpHalfBuffer[0];

    //
    // Run over all the float scanlines, quantizing, 
    // and re-assigning _rowPtr[y]. We need to translate
    // FLOAT XDR to HALF XDR.
    //

    for (unsigned int chan = 0; chan < _rowPtrs.size(); ++chan)
    {
        if (_type[chan] != FLOAT)
            continue;
    
        for (int y = 0; y < _height; ++y)
        {
            float       src = 0;
            const char *srcXdr = _rowPtrs[chan][y];
            char       *dstXdr = tmpHalfBufferPtr;
           
            for (int x = 0; x < _width; ++x)
            {

                Xdr::read<CharPtrIO> (srcXdr, src);

                //
                // Clamp to half ranges, instead of just casting. This
                // avoids introducing Infs which end up getting zeroed later
                //
                src = std::max (
                    std::min ((float) std::numeric_limits<half>::max(), src),
                              (float)-std::numeric_limits<half>::max());

                Xdr::write<CharPtrIO> (dstXdr, ((half)src).bits());

                //
                // Xdr::read and Xdr::write will advance the ptr
                //
            }

            _rowPtrs[chan][y] = (const char *)tmpHalfBufferPtr;
            tmpHalfBufferPtr += _width * sizeof (unsigned short);
        }
    }

    //
    // Pack DC components together by common plane, so we can get 
    // a little more out of differencing them. We'll always have 
    // one component per block, so we can computed offsets.
    //

    currDcComp[0] = (unsigned short *)_packedDc;

    for (unsigned int chan = 1; chan < _rowPtrs.size(); ++chan)
        currDcComp[chan] = currDcComp[chan-1] + numBlocksX * numBlocksY;

    for (int blocky = 0; blocky < numBlocksY; ++blocky)
    {
        for (int blockx = 0; blockx < numBlocksX; ++blockx)
        {
            half           h;
            unsigned short tmpShortXdr, tmpShortNative;
            char          *tmpCharPtr;

            for (unsigned int chan = 0; chan < _rowPtrs.size(); ++chan)
            {
                //
                // Break the source into 8x8 blocks. If we don't
                // fit at the edges, mirror.
                //
                // Also, convert from linear to nonlinear representation.
                // Our source is assumed to be XDR, and we need to convert
                // to NATIVE prior to converting to float.
                //
                // If we're converting linear -> nonlinear, assume that the
                // XDR -> NATIVE conversion is built into the lookup. Otherwise,
                // we'll need to explicitly do it.
                //

                for (int y = 0; y < 8; ++y)
                {
                    for (int x = 0; x < 8; ++x)
                    {
                        int vx = 8 * blockx + x;
                        int vy = 8 * blocky + y;

                        if (vx >= _width)
                            vx = _width - (vx - (_width - 1));
                        
                        if (vx < 0) vx = _width-1;

                        if (vy >=_height)
                            vy = _height - (vy - (_height - 1));

                        if (vy < 0) vy = _height-1;
                    
                        tmpShortXdr =
                            ((const unsigned short *)(_rowPtrs[chan])[vy])[vx];

                        if (_toNonlinear)
                        {
                            h.setBits (_toNonlinear[tmpShortXdr]);
                        }
                        else
                        {
                            const char *tmpConstCharPtr =
                                (const char *)(&tmpShortXdr);

                            Xdr::read<CharPtrIO>
                                (tmpConstCharPtr, tmpShortNative);

                            h.setBits(tmpShortNative);
                        }

                        _dctData[chan]._buffer[y * 8 + x] = (float)h;
                    } // x
                } // y
            } // chan

            //
            // Color space conversion
            //

            if (_rowPtrs.size() == 3)
            {
                csc709Forward64 (_dctData[0]._buffer, 
                                 _dctData[1]._buffer, 
                                 _dctData[2]._buffer);
            }

            for (unsigned int chan = 0; chan < _rowPtrs.size(); ++chan)
            {
                //
                // Forward DCT
                //

                dctForward8x8(_dctData[chan]._buffer);

                //
                // Quantize to half, and zigzag
                //

                if (chan == 0)
                {
                    for (int i = 0; i < 64; ++i)
                    {
                        halfCoef[i] =
                            quantize ((half)_dctData[chan]._buffer[i],
                                      _quantBaseError*_quantTableY[i]);
                    }
                }
                else
                {
                    for (int i = 0; i < 64; ++i)
                    {
                        halfCoef[i] =
                            quantize ((half)_dctData[chan]._buffer[i],
                                      _quantBaseError*_quantTableCbCr[i]);
                    }
                }

                toZigZag (halfZigCoef, halfCoef);
                
                //
                // Convert from NATIVE back to XDR, before we write out
                //

                for (int i = 0; i < 64; ++i)
                {
                    tmpCharPtr = (char *)&tmpShortXdr;
                    Xdr::write<CharPtrIO>(tmpCharPtr, halfZigCoef[i].bits());
                    halfZigCoef[i].setBits(tmpShortXdr);
                }

                //
                // Save the DC component separately, to be compressed on
                // its own.
                //

                *currDcComp[chan]++ = halfZigCoef[0].bits();
                _numDcComp++;
                
                //
                // Then RLE the AC components (which will record the count
                // of the resulting number of items)
                //

                rleAc (halfZigCoef, currAcComp);
            } // chan
        } // blockx
    } // blocky              
}